

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_Shift(ShiftForm3 Shift)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  code *in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  Image output;
  double shiftY;
  double shiftX;
  double maxShiftY;
  double maxShiftX;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  uint8_t intensity;
  uint32_t in_stack_fffffffffffffed8;
  uint32_t in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee5;
  uint8_t in_stack_fffffffffffffee6;
  byte bVar6;
  uint8_t in_stack_fffffffffffffee7;
  uint32_t *in_stack_fffffffffffffee8;
  Image *in_stack_fffffffffffffef0;
  Image *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  uint8_t value;
  uint uVar7;
  uint local_e4;
  undefined1 local_c8 [40];
  double local_a0;
  double local_98;
  undefined8 local_90;
  undefined8 local_88;
  int local_7c;
  int local_78;
  uint local_74;
  uint local_70;
  ImageTemplate<unsigned_char> local_38;
  uint8_t local_9;
  code *local_8;
  
  value = (uint8_t)((uint)in_stack_ffffffffffffff0c >> 0x18);
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  auVar5 = in_ZMM0._0_16_;
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffef0,(uint32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffee8,in_stack_fffffffffffffee7,in_stack_fffffffffffffee6
            );
  Test_Helper::uniformImage(value,in_stack_ffffffffffffff08,uVar3,in_stack_fffffffffffffef8);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e1f55);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (uint32_t *)
             CONCAT17(in_stack_fffffffffffffee7,
                      CONCAT16(in_stack_fffffffffffffee6,
                               CONCAT15(in_stack_fffffffffffffee5,
                                        CONCAT14(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0
                                                )))),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (uint32_t *)0x1e1f82);
  uVar1 = local_70;
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
  if (uVar1 < (uVar3 - local_78) - local_70) {
    local_e4 = local_70;
  }
  else {
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
    local_e4 = (uVar3 - local_78) - local_70;
  }
  uVar1 = local_74;
  auVar5 = vcvtusi2sd_avx512f(auVar5,local_e4);
  local_88 = auVar5._0_8_;
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
  uVar7 = local_74;
  if ((uVar3 - local_7c) - local_74 <= uVar1) {
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
    uVar7 = (uVar3 - local_7c) - local_74;
  }
  auVar5 = vcvtusi2sd_avx512f(auVar5,uVar7);
  local_90 = auVar5._0_8_;
  dVar4 = Unit_Test::randomFloatValue<double>
                    ((double)in_stack_fffffffffffffee8,
                     (double)CONCAT17(in_stack_fffffffffffffee7,
                                      CONCAT16(in_stack_fffffffffffffee6,
                                               CONCAT15(in_stack_fffffffffffffee5,
                                                        CONCAT14(in_stack_fffffffffffffee4,
                                                                 in_stack_fffffffffffffee0)))),
                     (double)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_98 = Unit_Test::randomFloatValue<double>
                       ((double)in_stack_fffffffffffffee8,
                        (double)CONCAT17(in_stack_fffffffffffffee7,
                                         CONCAT16(in_stack_fffffffffffffee6,
                                                  CONCAT15(in_stack_fffffffffffffee5,
                                                           CONCAT14(in_stack_fffffffffffffee4,
                                                                    in_stack_fffffffffffffee0)))),
                        (double)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_98 = dVar4 + local_98;
  dVar4 = Unit_Test::randomFloatValue<double>
                    ((double)in_stack_fffffffffffffee8,
                     (double)CONCAT17(in_stack_fffffffffffffee7,
                                      CONCAT16(in_stack_fffffffffffffee6,
                                               CONCAT15(in_stack_fffffffffffffee5,
                                                        CONCAT14(in_stack_fffffffffffffee4,
                                                                 in_stack_fffffffffffffee0)))),
                     (double)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_a0 = Unit_Test::randomFloatValue<double>
                       ((double)in_stack_fffffffffffffee8,
                        (double)CONCAT17(in_stack_fffffffffffffee7,
                                         CONCAT16(in_stack_fffffffffffffee6,
                                                  CONCAT15(in_stack_fffffffffffffee5,
                                                           CONCAT14(in_stack_fffffffffffffee4,
                                                                    in_stack_fffffffffffffee0)))),
                        (double)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_a0 = dVar4 + local_a0;
  (*local_8)(local_98,local_a0,local_c8,&local_38,local_70,local_74,local_78,local_7c);
  bVar2 = Unit_Test::equalSize
                    ((Image *)CONCAT17(in_stack_fffffffffffffee7,
                                       CONCAT16(in_stack_fffffffffffffee6,
                                                CONCAT15(in_stack_fffffffffffffee5,
                                                         CONCAT14(in_stack_fffffffffffffee4,
                                                                  in_stack_fffffffffffffee0)))),
                     in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
  bVar6 = false;
  if (bVar2) {
    bVar6 = Unit_Test::verifyImage
                      ((Image *)CONCAT17(bVar2,(uint7)CONCAT15(in_stack_fffffffffffffee5,
                                                               CONCAT14(in_stack_fffffffffffffee4,
                                                                        in_stack_fffffffffffffee0)))
                       ,(uint8_t)(in_stack_fffffffffffffedc >> 0x18));
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e2224);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e2231);
  return (bool)(bVar6 & 1);
}

Assistant:

bool form3_Shift(ShiftForm3 Shift)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const double maxShiftX = roiX < (input.width()  - roiWidth  - roiX) ? roiX : (input.width()  - roiWidth  - roiX);
        const double maxShiftY = roiY < (input.height() - roiHeight - roiY) ? roiY : (input.height() - roiHeight - roiY);
        const double shiftX = randomFloatValue<double>( -maxShiftX / 4, maxShiftX / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );
        const double shiftY = randomFloatValue<double>( -maxShiftY / 4, maxShiftY / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );

        const PenguinV_Image::Image output = Shift( input, roiX, roiY, roiWidth, roiHeight, shiftX, shiftY );

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, intensity );
    }